

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::FieldDef::Deserialize(FieldDef *this,Parser *parser,Field *field)

{
  SymbolTable<flatbuffers::Value> *attributes;
  BaseType BVar1;
  bool bVar2;
  bool required;
  uint16_t uVar3;
  Presence PVar4;
  String *this_00;
  Type *type;
  int64_t t;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Value *pVVar5;
  StructDef *pSVar6;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  double t_00;
  allocator<char> local_51;
  string nested_qualified_name;
  
  this_00 = reflection::Field::name(field);
  String::str_abi_cxx11_(&nested_qualified_name,this_00);
  std::__cxx11::string::operator=((string *)this,(string *)&nested_qualified_name);
  std::__cxx11::string::~string((string *)&nested_qualified_name);
  (this->super_Definition).defined_namespace = parser->current_namespace_;
  type = reflection::Field::type(field);
  bVar2 = Type::Deserialize(&(this->value).type,parser,type);
  if (!bVar2) {
    return false;
  }
  uVar3 = reflection::Field::offset(field);
  (this->value).offset = uVar3;
  BVar1 = (this->value).type.base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 10) {
    t = reflection::Field::default_integer(field);
    NumToString<long>(&nested_qualified_name,t);
  }
  else {
    if (1 < BVar1 - BASE_TYPE_FLOAT) goto LAB_0011770f;
    t_00 = reflection::Field::default_real(field);
    FloatToString<double>(&nested_qualified_name,t_00,0x11);
  }
  std::__cxx11::string::operator=
            ((string *)&(this->value).constant,(string *)&nested_qualified_name);
  std::__cxx11::string::~string((string *)&nested_qualified_name);
LAB_0011770f:
  bVar2 = reflection::Field::optional(field);
  required = reflection::Field::required(field);
  PVar4 = MakeFieldPresence(bVar2,required);
  this->presence = PVar4;
  uVar3 = reflection::Field::padding(field);
  this->padding = (ulong)uVar3;
  bVar2 = reflection::Field::key(field);
  this->key = bVar2;
  bVar2 = reflection::Field::offset64(field);
  this->offset64 = bVar2;
  attrs = reflection::Field::attributes(field);
  attributes = &(this->super_Definition).attributes;
  bVar2 = DeserializeAttributesCommon(attributes,parser,attrs);
  if (!bVar2) {
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nested_qualified_name,"flexbuffer",&local_51);
  pVVar5 = SymbolTable<flatbuffers::Value>::Lookup(attributes,&nested_qualified_name);
  std::__cxx11::string::~string((string *)&nested_qualified_name);
  if (pVVar5 != (Value *)0x0) {
    this->flexbuffer = true;
    parser->uses_flexbuffers_ = true;
    if ((this->value).type.base_type != BASE_TYPE_VECTOR) {
      return false;
    }
    if ((this->value).type.element != BASE_TYPE_UCHAR) {
      return false;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nested_qualified_name,"nested_flatbuffer",&local_51);
  pVVar5 = SymbolTable<flatbuffers::Value>::Lookup(attributes,&nested_qualified_name);
  std::__cxx11::string::~string((string *)&nested_qualified_name);
  if (pVVar5 != (Value *)0x0) {
    Namespace::GetFullyQualifiedName
              (&nested_qualified_name,parser->current_namespace_,&pVVar5->constant,1000);
    pSVar6 = Parser::LookupStruct(parser,&nested_qualified_name);
    this->nested_flatbuffer = pSVar6;
    std::__cxx11::string::~string((string *)&nested_qualified_name);
    if (pSVar6 == (StructDef *)0x0) {
      return false;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nested_qualified_name,"shared",&local_51);
  pVVar5 = SymbolTable<flatbuffers::Value>::Lookup(attributes,&nested_qualified_name);
  this->shared = pVVar5 != (Value *)0x0;
  std::__cxx11::string::~string((string *)&nested_qualified_name);
  documentation = reflection::Field::documentation(field);
  anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
  return true;
}

Assistant:

bool FieldDef::Deserialize(Parser &parser, const reflection::Field *field) {
  name = field->name()->str();
  defined_namespace = parser.current_namespace_;
  if (!value.type.Deserialize(parser, field->type())) return false;
  value.offset = field->offset();
  if (IsInteger(value.type.base_type)) {
    value.constant = NumToString(field->default_integer());
  } else if (IsFloat(value.type.base_type)) {
    value.constant = FloatToString(field->default_real(), 17);
  }
  presence = FieldDef::MakeFieldPresence(field->optional(), field->required());
  padding = field->padding();
  key = field->key();
  offset64 = field->offset64();
  if (!DeserializeAttributes(parser, field->attributes())) return false;
  // TODO: this should probably be handled by a separate attribute
  if (attributes.Lookup("flexbuffer")) {
    flexbuffer = true;
    parser.uses_flexbuffers_ = true;
    if (value.type.base_type != BASE_TYPE_VECTOR ||
        value.type.element != BASE_TYPE_UCHAR)
      return false;
  }
  if (auto nested = attributes.Lookup("nested_flatbuffer")) {
    auto nested_qualified_name =
        parser.current_namespace_->GetFullyQualifiedName(nested->constant);
    nested_flatbuffer = parser.LookupStruct(nested_qualified_name);
    if (!nested_flatbuffer) return false;
  }
  shared = attributes.Lookup("shared") != nullptr;
  DeserializeDoc(doc_comment, field->documentation());
  return true;
}